

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSkinnedMesh.cpp
# Opt level: O0

bool __thiscall irr::scene::CSkinnedMesh::useAnimationFrom(CSkinnedMesh *this,ISkinnedMesh *mesh)

{
  SJoint *pSVar1;
  __optional_eq_t<std::__cxx11::basic_string<char>,_char[1]> _Var2;
  __optional_eq_t<std::__cxx11::basic_string<char>,_std::__cxx11::basic_string<char>_> _Var3;
  u32 uVar4;
  SJoint **ppSVar5;
  long *in_RSI;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *in_RDI
  ;
  SJoint *otherJoint;
  u32 j;
  SJoint *joint;
  u32 i;
  bool unmatched;
  undefined4 in_stack_ffffffffffffffb8;
  u32 in_stack_ffffffffffffffbc;
  uint in_stack_ffffffffffffffc0;
  uint uVar6;
  SJoint *__lhs;
  uint local_24;
  uint local_18;
  byte local_11;
  
  local_11 = 0;
  local_18 = 0;
  while (uVar6 = local_18,
        uVar4 = core::array<irr::scene::ISkinnedMesh::SJoint_*>::size
                          ((array<irr::scene::ISkinnedMesh::SJoint_*> *)0x2a186b), uVar6 < uVar4) {
    ppSVar5 = core::array<irr::scene::ISkinnedMesh::SJoint_*>::operator[]
                        ((array<irr::scene::ISkinnedMesh::SJoint_*> *)
                         CONCAT44(uVar6,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc);
    pSVar1 = *ppSVar5;
    pSVar1->UseAnimationFrom = (SJoint *)0x0;
    _Var2 = ::std::operator==((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)CONCAT44(uVar6,in_stack_ffffffffffffffc0),
                              (char (*) [1])
                              CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if (_Var2) {
      local_11 = 1;
    }
    else {
      local_24 = 0;
      while( true ) {
        in_stack_ffffffffffffffc0 = local_24;
        (**(code **)(*in_RSI + 0xe0))();
        uVar4 = core::array<irr::scene::ISkinnedMesh::SJoint_*>::size
                          ((array<irr::scene::ISkinnedMesh::SJoint_*> *)0x2a18ea);
        if (uVar4 <= in_stack_ffffffffffffffc0) break;
        (**(code **)(*in_RSI + 0xe0))();
        ppSVar5 = core::array<irr::scene::ISkinnedMesh::SJoint_*>::operator[]
                            ((array<irr::scene::ISkinnedMesh::SJoint_*> *)
                             CONCAT44(uVar6,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc);
        __lhs = *ppSVar5;
        _Var3 = ::std::operator==(&__lhs->Name,in_RDI);
        if (_Var3) {
          pSVar1->UseAnimationFrom = __lhs;
        }
        local_24 = local_24 + 1;
      }
      if (pSVar1->UseAnimationFrom == (SJoint *)0x0) {
        local_11 = 1;
      }
    }
    local_18 = local_18 + 1;
  }
  checkForAnimation(_i);
  return (bool)((local_11 ^ 0xff) & 1);
}

Assistant:

bool CSkinnedMesh::useAnimationFrom(const ISkinnedMesh *mesh)
{
	bool unmatched = false;

	for (u32 i = 0; i < AllJoints.size(); ++i) {
		SJoint *joint = AllJoints[i];
		joint->UseAnimationFrom = 0;

		if (joint->Name == "")
			unmatched = true;
		else {
			for (u32 j = 0; j < mesh->getAllJoints().size(); ++j) {
				SJoint *otherJoint = mesh->getAllJoints()[j];
				if (joint->Name == otherJoint->Name) {
					joint->UseAnimationFrom = otherJoint;
				}
			}
			if (!joint->UseAnimationFrom)
				unmatched = true;
		}
	}

	checkForAnimation();

	return !unmatched;
}